

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# water.cpp
# Opt level: O3

shared_ptr<Image> runWaterEffect(Image *src,WaterEffectOptions *options)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  runtime_error *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Image *__tmp;
  WaterEffectOptions *pWVar6;
  shared_ptr<Image> sVar7;
  WaterEffectOptions *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  WaterEffectOptions *local_38;
  
  src->pixels = (Pixel *)0x0;
  (src->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38 = options;
  if ((char)in_RDX[2]._M_use_count == '\x01') {
    lVar2 = std::chrono::_V2::system_clock::now();
    runHistogramStage((Image *)&local_58,options);
    pWVar6 = local_58;
    local_40 = p_Stack_50;
    lVar3 = std::chrono::_V2::system_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Stage: Histogram:        ",0x19);
    poVar4 = std::ostream::_M_insert<double>((double)(lVar3 - lVar2) * 1e-09);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," s.",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if (*(char *)((long)&in_RDX[2]._M_use_count + 1) == '\0') {
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pWVar6 = (WaterEffectOptions *)0x0;
      _Var5._M_pi = extraout_RDX;
    }
    else {
      lVar2 = std::chrono::_V2::system_clock::now();
      if (pWVar6 == (WaterEffectOptions *)0x0) goto LAB_001134f4;
      runEnhanceStage((Image *)&local_58,(Histogram *)local_38,pWVar6);
      this_00 = p_Stack_50;
      pWVar6 = local_58;
      src->pixels = (Pixel *)local_58;
      (src->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)p_Stack_50;
      lVar3 = std::chrono::_V2::system_clock::now();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Stage: Contrast enhance: ",0x19);
      poVar4 = std::ostream::_M_insert<double>((double)(lVar3 - lVar2) * 1e-09);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," s.",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      _Var5._M_pi = extraout_RDX_00;
    }
  }
  else {
    if (*(char *)((long)&in_RDX[2]._M_use_count + 1) == '\x01') {
      std::chrono::_V2::system_clock::now();
      local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_001134f4:
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Cannot run enhance stage without histogram.");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pWVar6 = (WaterEffectOptions *)0x0;
    local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Var5._M_pi = in_RDX;
  }
  if (*(char *)((long)&in_RDX[2]._M_use_count + 3) == '\x01') {
    lVar2 = std::chrono::_V2::system_clock::now();
    if (pWVar6 == (WaterEffectOptions *)0x0) {
      runRippleStage((Image *)&local_58,local_38);
    }
    else {
      runRippleStage((Image *)&local_58,pWVar6);
    }
    p_Var1 = p_Stack_50;
    pWVar6 = local_58;
    local_58 = (WaterEffectOptions *)0x0;
    p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    src->pixels = (Pixel *)pWVar6;
    (src->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)p_Var1;
    if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
       p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
    }
    lVar3 = std::chrono::_V2::system_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Stage: Ripple effect:    ",0x19);
    poVar4 = std::ostream::_M_insert<double>((double)(lVar3 - lVar2) * 1e-09);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," s.",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    _Var5._M_pi = extraout_RDX_01;
    this_00 = p_Var1;
  }
  if (*(char *)&in_RDX[2]._vptr__Sp_counted_base == '\x01') {
    lVar2 = std::chrono::_V2::system_clock::now();
    if (pWVar6 == (WaterEffectOptions *)0x0) {
      runBlurStage((Image *)&local_58,local_38);
      src->pixels = (Pixel *)local_58;
      (src->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)p_Stack_50;
    }
    else {
      runBlurStage((Image *)&local_58,pWVar6);
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (src->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_start;
      src->pixels = (Pixel *)local_58;
      (src->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)p_Stack_50;
    }
    p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58 = (WaterEffectOptions *)0x0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_58 = (WaterEffectOptions *)0x0;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
      }
    }
    lVar3 = std::chrono::_V2::system_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Stage: Blur:             ",0x19);
    poVar4 = std::ostream::_M_insert<double>((double)(lVar3 - lVar2) * 1e-09);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," s.",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    _Var5._M_pi = extraout_RDX_02;
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    _Var5._M_pi = extraout_RDX_03;
  }
  sVar7.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi;
  sVar7.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = src;
  return (shared_ptr<Image>)sVar7.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Image> runWaterEffect(const Image *src, const WaterEffectOptions *options) {
  // Stage timer
  Timer ts;

  // Smart pointers to intermediate images:
  std::shared_ptr<Histogram> hist;
  std::shared_ptr<Image> img_result;

  // Histogram stage
  if (options->histogram) {
    ts.start();
    hist = runHistogramStage(src, options);
    ts.stop();
    std::cout << "Stage: Histogram:        " << ts.seconds() << " s." << std::endl;
  }

  // Contrast enhancement stage
  if (options->enhance) {
    ts.start();
    if (hist == nullptr) {
      throw std::runtime_error("Cannot run enhance stage without histogram.");
    }
    img_result = runEnhanceStage(src, hist.get(), options);
    ts.stop();
    std::cout << "Stage: Contrast enhance: " << ts.seconds() << " s." << std::endl;
  }

  // Ripple effect stage
  if (options->ripple) {
    ts.start();
    if (img_result == nullptr) {
      img_result = runRippleStage(src, options);
    } else {
      img_result = runRippleStage(img_result.get(), options);
    }
    ts.stop();
    std::cout << "Stage: Ripple effect:    " << ts.seconds() << " s." << std::endl;
  }

  // Gaussian blur stage
  if (options->blur) {
    ts.start();
    if (img_result == nullptr) {
      img_result = runBlurStage(src, options);
    } else {
      img_result = runBlurStage(img_result.get(), options);
    }
    ts.stop();
    std::cout << "Stage: Blur:             " << ts.seconds() << " s." << std::endl;
  }

  return img_result;
}